

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::GetLanguageStandardRequired(cmGeneratorTarget *this,string *lang)

{
  bool bVar1;
  cmValue local_20;
  string *local_18;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  local_18 = lang;
  lang_local = (string *)this;
  local_20 = GetPropertyWithPairedLanguageSupport(this,lang,"_STANDARD_REQUIRED");
  bVar1 = cmValue::IsOn(&local_20);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::GetLanguageStandardRequired(
  std::string const& lang) const
{
  return this->GetPropertyWithPairedLanguageSupport(lang, "_STANDARD_REQUIRED")
    .IsOn();
}